

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

void start_subcommand(strbuf *args)

{
  int iVar1;
  __pid_t _Var2;
  char **__argv;
  size_t sVar3;
  size_t len;
  size_t a;
  char *p;
  char **exec_args;
  size_t i;
  size_t nargs;
  pid_t pid;
  strbuf *args_local;
  
  iVar1 = pipe(signalpipe);
  if (iVar1 < 0) {
    perror("pipe");
    exit(1);
  }
  putty_signal(0x11,sigchld);
  i = 0;
  for (exec_args = (char **)0x0; exec_args < (char **)args->len;
      exec_args = (char **)((long)exec_args + 1)) {
    if (args->s[(long)exec_args] == '\0') {
      i = i + 1;
    }
  }
  __argv = (char **)safemalloc(i + 1,8,0);
  a = (size_t)args->s;
  for (len = 0; len < i; len = len + 1) {
    __argv[len] = (char *)a;
    sVar3 = strlen((char *)a);
    if (args->len - (a - (long)args->s) <= sVar3) {
      __assert_fail("len < args->len - (p - args->s)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/psocks.c"
                    ,0x6f,"void start_subcommand(strbuf *)");
    }
    a = sVar3 + 1 + a;
  }
  __argv[i] = (char *)0x0;
  _Var2 = fork();
  if (_Var2 < 0) {
    perror("fork");
    exit(1);
  }
  if (_Var2 == 0) {
    execvp(*__argv,__argv);
    perror("exec");
    _exit(0x7f);
  }
  subcommand_pid = _Var2;
  safefree(__argv);
  return;
}

Assistant:

static void start_subcommand(strbuf *args)
{
    pid_t pid;

    /*
     * Set up the pipe we'll use to tell us about SIGCHLD.
     */
    if (pipe(signalpipe) < 0) {
        perror("pipe");
        exit(1);
    }
    putty_signal(SIGCHLD, sigchld);

    /*
     * Make an array of argument pointers that execvp will like.
     */
    size_t nargs = 0;
    for (size_t i = 0; i < args->len; i++)
        if (args->s[i] == '\0')
            nargs++;

    char **exec_args = snewn(nargs + 1, char *);
    char *p = args->s;
    for (size_t a = 0; a < nargs; a++) {
        exec_args[a] = p;
        size_t len = strlen(p);
        assert(len < args->len - (p - args->s));
        p += 1 + len;
    }
    exec_args[nargs] = NULL;

    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    } else if (pid == 0) {
        execvp(exec_args[0], exec_args);
        perror("exec");
        _exit(127);
    } else {
        subcommand_pid = pid;
        sfree(exec_args);
    }
}